

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O0

int SUNLinSolInitialize_SPGMR(SUNLinearSolver S)

{
  N_Vector *pp_Var1;
  N_Vector_Ops p_Var2;
  _func_N_Vector_ID_N_Vector *p_Var3;
  SUNContext p_Var4;
  void *pvVar5;
  long *in_RDI;
  SUNLinearSolverContent_SPGMR content;
  int k;
  N_Vector w;
  int in_stack_ffffffffffffffec;
  int iVar6;
  int local_4;
  
  if (in_RDI == (long *)0x0) {
    local_4 = -0x321;
  }
  else {
    w = (N_Vector)*in_RDI;
    if (*(int *)((long)&w->ops + 4) < 0) {
      *(undefined4 *)((long)&w->ops + 4) = 0;
    }
    if (w[1].sunctx == (SUNContext)0x0) {
      *(undefined4 *)(*in_RDI + 0x20) = 0xfffffcdc;
      local_4 = *(int *)(*in_RDI + 0x20);
    }
    else {
      if (((*(int *)((long)&w->content + 4) != 1) && (*(int *)((long)&w->content + 4) != 2)) &&
         (*(int *)((long)&w->content + 4) != 3)) {
        *(undefined4 *)((long)&w->content + 4) = 0;
      }
      if ((*(int *)((long)&w->content + 4) == 0) || (w[2].sunctx != (SUNContext)0x0)) {
        if (w[4].content == (void *)0x0) {
          pp_Var1 = N_VCloneVectorArray(in_stack_ffffffffffffffec,w);
          w[4].content = pp_Var1;
          if (w[4].content == (void *)0x0) {
            *(undefined4 *)&w[1].ops = 0xfffffcdd;
            return -0x323;
          }
        }
        if (w[4].ops == (N_Vector_Ops)0x0) {
          p_Var2 = (N_Vector_Ops)malloc((long)(*(int *)&w->content + 1) << 3);
          w[4].ops = p_Var2;
          if (w[4].ops == (N_Vector_Ops)0x0) {
            *(undefined4 *)&w[1].ops = 0xfffffcdd;
            return -0x323;
          }
          for (iVar6 = 0; iVar6 <= *(int *)&w->content; iVar6 = iVar6 + 1) {
            (&(w[4].ops)->nvgetvectorid)[iVar6] = (_func_N_Vector_ID_N_Vector *)0x0;
            p_Var3 = (_func_N_Vector_ID_N_Vector *)malloc((long)*(int *)&w->content << 3);
            (&(w[4].ops)->nvgetvectorid)[iVar6] = p_Var3;
            if ((&(w[4].ops)->nvgetvectorid)[iVar6] == (_func_N_Vector_ID_N_Vector *)0x0) {
              *(undefined4 *)&w[1].ops = 0xfffffcdd;
              return -0x323;
            }
          }
        }
        if (w[4].sunctx == (SUNContext)0x0) {
          p_Var4 = (SUNContext)malloc((long)(*(int *)&w->content << 1) << 3);
          w[4].sunctx = p_Var4;
          if (w[4].sunctx == (SUNContext)0x0) {
            *(undefined4 *)&w[1].ops = 0xfffffcdd;
            return -0x323;
          }
        }
        if (w[5].ops == (N_Vector_Ops)0x0) {
          p_Var2 = (N_Vector_Ops)malloc((long)(*(int *)&w->content + 1) << 3);
          w[5].ops = p_Var2;
          if (w[5].ops == (N_Vector_Ops)0x0) {
            *(undefined4 *)&w[1].ops = 0xfffffcdd;
            return -0x323;
          }
        }
        if (w[6].content == (void *)0x0) {
          pvVar5 = malloc((long)(*(int *)&w->content + 1) << 3);
          w[6].content = pvVar5;
          if (w[6].content == (void *)0x0) {
            *(undefined4 *)&w[1].ops = 0xfffffcdd;
            return -0x323;
          }
        }
        if (w[6].ops == (N_Vector_Ops)0x0) {
          p_Var2 = (N_Vector_Ops)malloc((long)(*(int *)&w->content + 1) << 3);
          w[6].ops = p_Var2;
          if (w[6].ops == (N_Vector_Ops)0x0) {
            *(undefined4 *)&w[1].ops = 0xfffffcdd;
            return -0x323;
          }
        }
        *(undefined4 *)&w[1].ops = 0;
        local_4 = 0;
      }
      else {
        *(undefined4 *)(*in_RDI + 0x20) = 0xfffffcd9;
        local_4 = *(int *)(*in_RDI + 0x20);
      }
    }
  }
  return local_4;
}

Assistant:

int SUNLinSolInitialize_SPGMR(SUNLinearSolver S)
{
  int k;
  SUNLinearSolverContent_SPGMR content;

  /* set shortcut to SPGMR memory structure */
  if (S == NULL) return(SUNLS_MEM_NULL);
  content = SPGMR_CONTENT(S);

  /* ensure valid options */
  if (content->max_restarts < 0)
    content->max_restarts = SUNSPGMR_MAXRS_DEFAULT;

  if (content->ATimes == NULL) {
    LASTFLAG(S) = SUNLS_ATIMES_NULL;
    return(LASTFLAG(S));
  }

  if ( (content->pretype != SUN_PREC_LEFT) &&
       (content->pretype != SUN_PREC_RIGHT) &&
       (content->pretype != SUN_PREC_BOTH) )
    content->pretype = SUN_PREC_NONE;

  if ((content->pretype != SUN_PREC_NONE) && (content->Psolve == NULL)) {
    LASTFLAG(S) = SUNLS_PSOLVE_NULL;
    return(LASTFLAG(S));
  }

  /* allocate solver-specific memory (where the size depends on the
     choice of maxl) here */

  /*   Krylov subspace vectors */
  if (content->V == NULL) {
    content->V = N_VCloneVectorArray(content->maxl+1, content->vtemp);
    if (content->V == NULL) {
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }

  /*   Hessenberg matrix Hes */
  if (content->Hes == NULL) {
    content->Hes = (realtype **) malloc((content->maxl+1)*sizeof(realtype *));
    if (content->Hes == NULL) {
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }

    for (k=0; k<=content->maxl; k++) {
      content->Hes[k] = NULL;
      content->Hes[k] = (realtype *) malloc(content->maxl*sizeof(realtype));
      if (content->Hes[k] == NULL) {
        content->last_flag = SUNLS_MEM_FAIL;
        return(SUNLS_MEM_FAIL);
      }
    }
  }

  /*   Givens rotation components */
  if (content->givens == NULL) {
    content->givens = (realtype *) malloc(2*content->maxl*sizeof(realtype));
    if (content->givens == NULL) {
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }

  /*    y and g vectors */
  if (content->yg == NULL) {
    content->yg = (realtype *) malloc((content->maxl+1)*sizeof(realtype));
    if (content->yg == NULL) {
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }

  /*    cv vector for fused vector ops */
  if (content->cv == NULL) {
    content->cv = (realtype *) malloc((content->maxl+1)*sizeof(realtype));
    if (content->cv == NULL) {
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }

  /*    Xv vector for fused vector ops */
  if (content->Xv == NULL) {
    content->Xv = (N_Vector *) malloc((content->maxl+1)*sizeof(N_Vector));
    if (content->Xv == NULL) {
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }

  /* return with success */
  content->last_flag = SUNLS_SUCCESS;
  return(SUNLS_SUCCESS);
}